

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void adjustlocalvars(LexState *ls,int nvars)

{
  byte bVar1;
  int iVar2;
  FuncState *pFVar3;
  Vardesc *pVVar4;
  TString *v;
  Proto *o;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  LocVar *pLVar8;
  short sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  LocVar *pLVar13;
  int iVar14;
  char cVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pFVar3 = ls->fs;
  uVar7 = (uint)pFVar3->nactvar;
  do {
    if ((int)uVar7 < 1) {
      cVar15 = '\0';
      goto LAB_0010f613;
    }
    uVar7 = uVar7 - 1;
    pVVar4 = (pFVar3->ls->dyd->actvar).arr;
    lVar10 = (long)(int)(pFVar3->firstlocal + uVar7);
  } while (*(char *)((long)pVVar4 + lVar10 * 0x18 + 9) == '\x03');
  cVar15 = (&pVVar4->vd)[lVar10].ridx + '\x01';
LAB_0010f613:
  if (0 < nvars) {
    iVar14 = 0;
    do {
      bVar1 = pFVar3->nactvar;
      pFVar3->nactvar = bVar1 + 1;
      pVVar4 = (pFVar3->ls->dyd->actvar).arr;
      lVar10 = (long)pFVar3->firstlocal + (ulong)bVar1;
      *(char *)((long)pVVar4 + lVar10 * 0x18 + 10) = cVar15;
      v = *(TString **)((long)pVVar4 + lVar10 * 0x18 + 0x10);
      o = pFVar3->f;
      iVar2 = o->sizelocvars;
      pLVar8 = (LocVar *)
               luaM_growaux_(ls->L,o->locvars,(int)pFVar3->ndebugvars,&o->sizelocvars,0x10,0x7fff,
                             "local variables");
      auVar6 = _DAT_0011fb90;
      auVar5 = _DAT_0011fb80;
      o->locvars = pLVar8;
      if (iVar2 < o->sizelocvars) {
        lVar11 = (long)o->sizelocvars - (long)iVar2;
        lVar12 = lVar11 + -1;
        auVar17._8_4_ = (int)lVar12;
        auVar17._0_8_ = lVar12;
        auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
        pLVar13 = pLVar8 + (long)iVar2 + 1;
        auVar17 = auVar17 ^ auVar6;
        uVar16 = 0;
        do {
          auVar18._8_4_ = (int)uVar16;
          auVar18._0_8_ = uVar16;
          auVar18._12_4_ = (int)(uVar16 >> 0x20);
          auVar18 = (auVar18 | auVar5) ^ auVar6;
          if ((bool)(~(auVar17._4_4_ < auVar18._4_4_ ||
                      auVar17._0_4_ < auVar18._0_4_ && auVar18._4_4_ == auVar17._4_4_) & 1)) {
            pLVar13[-1].varname = (TString *)0x0;
          }
          if (auVar18._12_4_ <= auVar17._12_4_ &&
              (auVar18._8_4_ <= auVar17._8_4_ || auVar18._12_4_ != auVar17._12_4_)) {
            pLVar13->varname = (TString *)0x0;
          }
          uVar16 = uVar16 + 2;
          pLVar13 = pLVar13 + 2;
        } while ((lVar11 + 1U & 0xfffffffffffffffe) != uVar16);
      }
      sVar9 = pFVar3->ndebugvars;
      pLVar8[sVar9].varname = v;
      pLVar8[sVar9].startpc = pFVar3->pc;
      if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
        luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)v);
        sVar9 = pFVar3->ndebugvars;
      }
      cVar15 = cVar15 + '\x01';
      pFVar3->ndebugvars = sVar9 + 1;
      (&pVVar4->vd)[lVar10].pidx = sVar9;
      iVar14 = iVar14 + 1;
    } while (iVar14 != nvars);
  }
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  int reglevel = luaY_nvarstack(fs);
  int i;
  for (i = 0; i < nvars; i++) {
    int vidx = fs->nactvar++;
    Vardesc *var = getlocalvardesc(fs, vidx);
    var->vd.ridx = reglevel++;
    var->vd.pidx = registerlocalvar(ls, fs, var->vd.name);
  }
}